

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

ms * __thiscall llvm::APInt::magic(ms *__return_storage_ptr__,APInt *this)

{
  bool bVar1;
  uint local_184;
  APInt local_180;
  APInt local_170;
  APInt q1;
  APInt anc;
  APInt ad;
  APInt signedMin;
  APInt q2;
  APInt t;
  APInt delta;
  APInt r1;
  APInt local_d0;
  APInt r2;
  APInt local_b0;
  APInt local_a0;
  APInt local_90;
  APInt local_80;
  APInt local_70;
  APInt local_60;
  APInt local_50;
  APInt local_40;
  
  q1.BitWidth = 1;
  ad.U.VAL = 0;
  anc.U.VAL = 0;
  delta.U.VAL = 0;
  q1.U.VAL = 0;
  r1.U.VAL = 0;
  q2.U.VAL = 0;
  r2.U.VAL = 0;
  t.U.VAL = 0;
  anc.BitWidth = q1.BitWidth;
  ad.BitWidth = q1.BitWidth;
  q2.BitWidth = q1.BitWidth;
  t.BitWidth = q1.BitWidth;
  delta.BitWidth = q1.BitWidth;
  r1.BitWidth = q1.BitWidth;
  r2.BitWidth = q1.BitWidth;
  getSignedMinValue(&signedMin,this->BitWidth);
  (__return_storage_ptr__->m).BitWidth = 1;
  (__return_storage_ptr__->m).U.VAL = 0;
  abs(&local_180,(uint)this);
  operator=(&ad,&local_180);
  ~APInt(&local_180);
  lshr(&local_170,(uint)this);
  operator+((llvm *)&local_180,&signedMin,&local_170);
  operator=(&t,&local_180);
  ~APInt(&local_180);
  ~APInt(&local_170);
  APInt(&local_d0,&t);
  operator-((llvm *)&local_170,&local_d0,1);
  urem(&local_40,&t);
  operator-((llvm *)&local_180,&local_170,&local_40);
  operator=(&anc,&local_180);
  ~APInt(&local_180);
  ~APInt(&local_40);
  ~APInt(&local_170);
  ~APInt(&local_d0);
  local_184 = this->BitWidth;
  udiv(&local_180,&signedMin);
  operator=(&q1,&local_180);
  ~APInt(&local_180);
  operator*(&local_170,&q1);
  operator-((llvm *)&local_180,&signedMin,&local_170);
  operator=(&r1,&local_180);
  ~APInt(&local_180);
  ~APInt(&local_170);
  udiv(&local_180,&signedMin);
  operator=(&q2,&local_180);
  ~APInt(&local_180);
  operator*(&local_170,&q2);
  operator-((llvm *)&local_180,&signedMin,&local_170);
  operator=(&r2,&local_180);
  ~APInt(&local_180);
  ~APInt(&local_170);
  do {
    shl(&local_180,(uint)&q1);
    operator=(&q1,&local_180);
    ~APInt(&local_180);
    shl(&local_180,(uint)&r1);
    operator=(&r1,&local_180);
    ~APInt(&local_180);
    bVar1 = uge(&r1,&anc);
    if (bVar1) {
      APInt(&local_50,&q1);
      operator+((llvm *)&local_180,&local_50,1);
      operator=(&q1,&local_180);
      ~APInt(&local_180);
      ~APInt(&local_50);
      APInt(&local_60,&r1);
      operator-((llvm *)&local_180,&local_60,&anc);
      operator=(&r1,&local_180);
      ~APInt(&local_180);
      ~APInt(&local_60);
    }
    shl(&local_180,(uint)&q2);
    operator=(&q2,&local_180);
    ~APInt(&local_180);
    shl(&local_180,(uint)&r2);
    operator=(&r2,&local_180);
    ~APInt(&local_180);
    bVar1 = uge(&r2,&ad);
    if (bVar1) {
      APInt(&local_70,&q2);
      operator+((llvm *)&local_180,&local_70,1);
      operator=(&q2,&local_180);
      ~APInt(&local_180);
      ~APInt(&local_70);
      APInt(&local_80,&r2);
      operator-((llvm *)&local_180,&local_80,&ad);
      operator=(&r2,&local_180);
      ~APInt(&local_180);
      ~APInt(&local_80);
    }
    APInt(&local_90,&ad);
    operator-((llvm *)&local_180,&local_90,&r2);
    operator=(&delta,&local_180);
    ~APInt(&local_180);
    ~APInt(&local_90);
    bVar1 = ult(&q1,&delta);
    if (!bVar1) {
      bVar1 = operator==(&q1,&delta);
      if (!bVar1) {
LAB_0016cd24:
        APInt(&local_a0,&q2);
        operator+((llvm *)&local_180,&local_a0,1);
        operator=(&__return_storage_ptr__->m,&local_180);
        ~APInt(&local_180);
        ~APInt(&local_a0);
        bVar1 = isNegative(this);
        if (bVar1) {
          APInt(&local_b0,&__return_storage_ptr__->m);
          operator-((llvm *)&local_180,&local_b0);
          operator=(&__return_storage_ptr__->m,&local_180);
          ~APInt(&local_180);
          ~APInt(&local_b0);
        }
        __return_storage_ptr__->s = local_184 - this->BitWidth;
        ~APInt(&signedMin);
        ~APInt(&t);
        ~APInt(&r2);
        ~APInt(&q2);
        ~APInt(&r1);
        ~APInt(&q1);
        ~APInt(&delta);
        ~APInt(&anc);
        ~APInt(&ad);
        return __return_storage_ptr__;
      }
      bVar1 = operator==(&r1,0);
      if (!bVar1) goto LAB_0016cd24;
    }
    local_184 = local_184 + 1;
  } while( true );
}

Assistant:

APInt::ms APInt::magic() const {
  const APInt& d = *this;
  unsigned p;
  APInt ad, anc, delta, q1, r1, q2, r2, t;
  APInt signedMin = APInt::getSignedMinValue(d.getBitWidth());
  struct ms mag;

  ad = d.abs();
  t = signedMin + (d.lshr(d.getBitWidth() - 1));
  anc = t - 1 - t.urem(ad);   // absolute value of nc
  p = d.getBitWidth() - 1;    // initialize p
  q1 = signedMin.udiv(anc);   // initialize q1 = 2p/abs(nc)
  r1 = signedMin - q1*anc;    // initialize r1 = rem(2p,abs(nc))
  q2 = signedMin.udiv(ad);    // initialize q2 = 2p/abs(d)
  r2 = signedMin - q2*ad;     // initialize r2 = rem(2p,abs(d))
  do {
    p = p + 1;
    q1 = q1<<1;          // update q1 = 2p/abs(nc)
    r1 = r1<<1;          // update r1 = rem(2p/abs(nc))
    if (r1.uge(anc)) {  // must be unsigned comparison
      q1 = q1 + 1;
      r1 = r1 - anc;
    }
    q2 = q2<<1;          // update q2 = 2p/abs(d)
    r2 = r2<<1;          // update r2 = rem(2p/abs(d))
    if (r2.uge(ad)) {   // must be unsigned comparison
      q2 = q2 + 1;
      r2 = r2 - ad;
    }
    delta = ad - r2;
  } while (q1.ult(delta) || (q1 == delta && r1 == 0));

  mag.m = q2 + 1;
  if (d.isNegative()) mag.m = -mag.m;   // resulting magic number
  mag.s = p - d.getBitWidth();          // resulting shift
  return mag;
}